

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToWeeksOperator::Operation<long,duckdb::interval_t>(long input)

{
  bool bVar1;
  OutOfRangeException *this;
  interval_t iVar2;
  undefined1 auVar3 [16];
  int result_1;
  interval_t result;
  int local_54;
  string local_50;
  undefined4 local_30;
  int aiStack_2c [3];
  
  bVar1 = duckdb::TryCast::Operation<long,int>(input,&local_54,false);
  if (!bVar1) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_50,(duckdb *)input,auVar3._8_8_);
    duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_50);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30 = 0;
  bVar1 = duckdb::TryMultiplyOperator::Operation<int,int,int>(local_54,7,aiStack_2c);
  if (bVar1) {
    iVar2.days = aiStack_2c[0];
    iVar2.months = local_30;
    iVar2.micros = 0;
    return iVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Interval value %d weeks out of range","");
  OutOfRangeException::OutOfRangeException<long>(this,&local_50,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.months = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::DAYS_PER_WEEK, result.days)) {
			throw OutOfRangeException("Interval value %d weeks out of range", input);
		}
		result.micros = 0;
		return result;
	}